

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppTVar3;
  pointer piVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  pointer ppTVar9;
  TestPartResult *pTVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  pointer pbVar16;
  int iVar17;
  pointer ppEVar18;
  TestSuite *this_00;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  TestResult *this_01;
  pointer ppEVar19;
  pointer pbVar20;
  byte bVar21;
  allocator local_79;
  int local_78;
  int local_74;
  pointer local_70;
  pointer local_68;
  ulong local_60;
  long local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&g_argvs_abi_cxx11_);
  pbVar20 = local_50.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  if (g_help_flag != '\0') {
    return true;
  }
  PostFlagParsingInit(this);
  WriteToShardStatusFileIfNeeded();
  pIVar1 = (this->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  bVar6 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                      pIVar1 != (InternalRunDeathTestFlag *)0x0);
  local_74 = FilterTests(this,(uint)!bVar6);
  if (FLAGS_gtest_list_tests == '\x01') {
    ListTestsMatchingFilter(this);
    return true;
  }
  iVar11 = FLAGS_gtest_random_seed;
  if (FLAGS_gtest_random_seed == 0) {
    lVar8 = std::chrono::_V2::system_clock::now();
    iVar11 = (int)(SUB168(SEXT816(lVar8) * SEXT816(0x431bde82d7b634db),8) >> 0x12) -
             (SUB164(SEXT816(lVar8) * SEXT816(0x431bde82d7b634db),0xc) >> 0x1f);
  }
  this->random_seed_ = (iVar11 - 1U) % 99999 + 1;
  pTVar2 = (this->listeners_).repeater_;
  lVar8 = std::chrono::_V2::system_clock::now();
  this->start_timestamp_ = lVar8 / 1000000;
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2,this->parent_);
  bVar5 = FLAGS_gtest_recreate_environments_when_repeating;
  uVar13 = 1;
  if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
    uVar13 = (ulong)FLAGS_gtest_repeat;
  }
  iVar11 = (int)uVar13;
  if (iVar11 != 0) {
    local_70 = local_50.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_68 = pbVar20;
    local_78 = iVar11 + -1;
    bVar21 = 0;
    uVar15 = 0;
    local_60 = uVar13;
LAB_00133799:
    ppTVar3 = (this->test_suites_).
              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar9 = (this->test_suites_).
                   super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppTVar9 != ppTVar3;
        ppTVar9 = ppTVar9 + 1) {
      TestSuite::ClearResult(*ppTVar9);
    }
    local_58 = std::chrono::_V2::steady_clock::now();
    iVar14 = (int)uVar15;
    if (0 < local_74) {
      if (FLAGS_gtest_shuffle == '\x01') {
        (this->random_).state_ = this->random_seed_;
        ShuffleTests(this);
      }
      (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])(pTVar2,this->parent_,uVar15);
      if (iVar14 == 0 || (iVar11 < 0 || (bVar5 & 1) != 0)) {
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
        ppEVar19 = (this->environments_).
                   super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        for (ppEVar18 = (this->environments_).
                        super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppEVar18 != ppEVar19;
            ppEVar18 = ppEVar18 + 1) {
          (**(code **)(*(long *)*ppEVar18 + 0x10))();
        }
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
      }
      bVar6 = Test::IsSkipped();
      if (bVar6) {
        UnitTest::GetInstance();
        if ((UnitTest::GetInstance::instance.impl_)->current_test_info_ == (TestInfo *)0x0) {
          if ((UnitTest::GetInstance::instance.impl_)->current_test_suite_ == (TestSuite *)0x0) {
            this_01 = &(UnitTest::GetInstance::instance.impl_)->ad_hoc_test_result_;
          }
          else {
            this_01 = &(UnitTest::GetInstance::instance.impl_)->current_test_suite_->
                       ad_hoc_test_result_;
          }
        }
        else {
          this_01 = &(UnitTest::GetInstance::instance.impl_)->current_test_info_->result_;
        }
        if (0 < (int)((ulong)((long)(this_01->test_part_results_).
                                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_01->test_part_results_).
                                   super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
          iVar17 = 0;
          do {
            pTVar10 = TestResult::GetTestPartResult(this_01,iVar17);
            if (pTVar10->type_ == kSkip) {
              std::__cxx11::string::string
                        ((string *)&local_50,(pTVar10->message_)._M_dataplus._M_p,&local_79);
              puts((char *)local_50.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
              if (local_50.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&local_50.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(local_50.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&((local_50.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->_M_dataplus)._M_p + 1));
              }
            }
            iVar17 = iVar17 + 1;
            iVar7 = (int)((ulong)((long)(this_01->test_part_results_).
                                        super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this_01->test_part_results_).
                                       super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
          } while (SBORROW4(iVar17,iVar7 * -0x49249249) != iVar17 + iVar7 * 0x49249249 < 0);
        }
        fflush(_stdout);
      }
      else {
        bVar6 = Test::HasFatalFailure();
        if (bVar6) {
          bVar6 = Test::HasFatalFailure();
          if ((bVar6) &&
             (ppTVar9 = (this->test_suites_).
                        super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
             0 < (int)((ulong)((long)(this->test_suites_).
                                     super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar9) >>
                      3))) {
            lVar8 = 0;
            do {
              piVar4 = (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar12 = 0xffffffff;
              if (lVar8 < (int)((ulong)((long)(this->test_suite_indices_).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish - (long)piVar4) >> 2
                               )) {
                uVar12 = piVar4[lVar8];
              }
              TestSuite::Skip(ppTVar9[uVar12]);
              lVar8 = lVar8 + 1;
              ppTVar9 = (this->test_suites_).
                        super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (lVar8 < (int)((ulong)((long)(this->test_suites_).
                                                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ppTVar9) >> 3));
          }
        }
        else {
          ppTVar9 = (this->test_suites_).
                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)((ulong)((long)(this->test_suites_).
                                      super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar9) >>
                       3)) {
            lVar8 = 1;
            do {
              piVar4 = (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar12 = 0xffffffff;
              if (lVar8 + -1 <
                  (long)(int)((ulong)((long)(this->test_suite_indices_).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish - (long)piVar4) >> 2))
              {
                uVar12 = piVar4[lVar8 + -1];
              }
              TestSuite::Run(ppTVar9[uVar12]);
              if (FLAGS_gtest_fail_fast == '\x01') {
                piVar4 = (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                uVar12 = 0xffffffff;
                if (lVar8 + -1 <
                    (long)(int)((ulong)((long)(this->test_suite_indices_).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish - (long)piVar4) >> 2
                               )) {
                  uVar12 = piVar4[lVar8 + -1];
                }
                if ((int)uVar12 < 0) {
                  this_00 = (TestSuite *)0x0;
                }
                else {
                  this_00 = (this->test_suites_).
                            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar12];
                }
                iVar17 = TestSuite::failed_test_count(this_00);
                if ((0 < iVar17) ||
                   (bVar6 = TestResult::Failed(&this_00->ad_hoc_test_result_), bVar6))
                goto LAB_00133a36;
              }
              ppTVar9 = (this->test_suites_).
                        super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar6 = lVar8 < (int)((ulong)((long)(this->test_suites_).
                                                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)ppTVar9) >> 3);
              lVar8 = lVar8 + 1;
            } while (bVar6);
          }
        }
      }
      goto LAB_00133afe;
    }
    (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])(pTVar2,this->parent_,uVar15);
    goto LAB_00133b4a;
  }
  bVar6 = true;
  pbVar16 = local_50.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
LAB_00133bed:
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0x11])(pTVar2,this->parent_);
  ppEVar19 = (this->environments_).
             super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar18 = (this->environments_).
                  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppEVar18 != ppEVar19;
      ppEVar18 = ppEVar18 + 1) {
    if (*ppEVar18 != (Environment *)0x0) {
      (**(code **)(*(long *)*ppEVar18 + 8))();
    }
  }
  ppEVar18 = (this->environments_).
             super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((this->environments_).
      super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar18) {
    (this->environments_).
    super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar18;
  }
  if (pbVar20 == pbVar16) {
    ColoredPrintf(kRed,
                  "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                 );
  }
  return bVar6;
LAB_00133a36:
  for (; ppTVar9 = (this->test_suites_).
                   super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
      (int)lVar8 <
      (int)((ulong)((long)(this->test_suites_).
                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar9) >> 3);
      lVar8 = lVar8 + 1) {
    piVar4 = (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0xffffffff;
    if (lVar8 < (int)((ulong)((long)(this->test_suite_indices_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar4) >> 2)) {
      uVar12 = piVar4[lVar8];
    }
    TestSuite::Skip(ppTVar9[uVar12]);
  }
LAB_00133afe:
  if (iVar14 == local_78 || (iVar11 < 0 || (bVar5 & 1) != 0)) {
    (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2,this->parent_);
    ppEVar18 = (this->environments_).
               super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    for (ppEVar19 = (this->environments_).
                    super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish; ppEVar19 != ppEVar18;
        ppEVar19 = ppEVar19 + -1) {
      (**(code **)(*(long *)ppEVar19[-1] + 0x18))();
    }
    (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xf])(pTVar2,this->parent_);
  }
LAB_00133b4a:
  lVar8 = std::chrono::_V2::steady_clock::now();
  this->elapsed_time_ = (lVar8 - local_58) / 1000000;
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0x10])(pTVar2,this->parent_,uVar15);
  bVar6 = Passed(this);
  if (!bVar6) {
    bVar21 = 1;
  }
  UnshuffleTests(this);
  if (FLAGS_gtest_shuffle == '\x01') {
    iVar17 = GetNextRandomSeed(this->random_seed_);
    this->random_seed_ = iVar17;
  }
  uVar15 = (ulong)(iVar14 + 1U);
  if (iVar14 + 1U == (uint)local_60 && -1 < (int)(uint)local_60) goto code_r0x00133bda;
  goto LAB_00133799;
code_r0x00133bda:
  bVar6 = (bool)(bVar21 ^ 1);
  pbVar16 = local_70;
  pbVar20 = local_68;
  goto LAB_00133bed;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag) return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

#if GTEST_HAS_FILE_SYSTEM
  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();
#endif  // GTEST_HAS_FILE_SYSTEM

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#ifdef GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_ != nullptr);
#if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
#endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run =
      FilterTests(should_shard ? HONOR_SHARDING_PROTOCOL
                               : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG_GET(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GetRandomSeedFromFlag(GTEST_FLAG_GET(random_seed));

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG_GET(repeat);

  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;

  // Should test environments be set up and torn down for each repeat, or only
  // set up on the first and torn down on the last iteration? If there is no
  // "last" iteration because the tests will repeat forever, always recreate the
  // environments to avoid leaks in case one of the environments is using
  // resources that are external to this process. Without this check there would
  // be no way to clean up those external resources automatically.
  const bool recreate_environments_when_repeating =
      GTEST_FLAG_GET(recreate_environments_when_repeating) ||
      gtest_repeat_forever;

  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    Timer timer;

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG_GET(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand. If test environments aren't
      // recreated for each iteration, only do so on the first iteration.
      if (i == 0 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsSetUpStart(*parent_);
        ForEach(environments_, SetUpEnvironment);
        repeater->OnEnvironmentsSetUpEnd(*parent_);
      }

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG_GET(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      } else if (Test::HasFatalFailure()) {
        // If there was a fatal failure during the global setup then we know we
        // aren't going to run any tests. Explicitly mark all of the tests as
        // skipped to make this obvious in the output.
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Skip();
        }
      }

      // Tears down all environments in reverse order afterwards. If test
      // environments aren't recreated for each iteration, only do so on the
      // last iteration.
      if (i == repeat - 1 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsTearDownStart(*parent_);
        std::for_each(environments_.rbegin(), environments_.rend(),
                      TearDownEnvironment);
        repeater->OnEnvironmentsTearDownEnd(*parent_);
      }
    }

    elapsed_time_ = timer.Elapsed();

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG_GET(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);
  // Destroy environments in normal code, not in static teardown.
  bool delete_environment_on_teardown = true;
  if (delete_environment_on_teardown) {
    ForEach(environments_, internal::Delete<Environment>);
    environments_.clear();
  }

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
  }

  return !failed;
}